

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

void pigpio_stop(int pi)

{
  if (((uint)pi < 0x20) && (gPiInUse[(uint)pi] != 0)) {
    if (gPthNotify[(uint)pi] != (pthread_t *)0x0) {
      stop_thread(gPthNotify[(uint)pi]);
      gPthNotify[(uint)pi] = (pthread_t *)0x0;
    }
    if (-1 < gPigCommand[(uint)pi]) {
      if (-1 < gPigHandle[(uint)pi]) {
        pigpio_command(pi,0x15,gPigHandle[(uint)pi],0,1);
        gPigHandle[(uint)pi] = -1;
      }
      close(gPigCommand[(uint)pi]);
      gPigCommand[(uint)pi] = -1;
    }
    if (-1 < gPigNotify[(uint)pi]) {
      close(gPigNotify[(uint)pi]);
      gPigNotify[(uint)pi] = -1;
    }
    gPiInUse[(uint)pi] = 0;
  }
  return;
}

Assistant:

void pigpio_stop(int pi)
{
   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi]) return;

   if (gPthNotify[pi])
   {
      stop_thread(gPthNotify[pi]);
      gPthNotify[pi] = 0;
   }

   if (gPigCommand[pi] >= 0)
   {
      if (gPigHandle[pi] >= 0)
      {
         pigpio_command(pi, PI_CMD_NC, gPigHandle[pi], 0, 1);
         gPigHandle[pi] = -1;
      }

      close(gPigCommand[pi]);
      gPigCommand[pi] = -1;
   }

   if (gPigNotify[pi] >= 0)
   {
      close(gPigNotify[pi]);
      gPigNotify[pi] = -1;
   }

   gPiInUse[pi] = 0;
}